

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O3

TPZSYsmpMatrix<std::complex<long_double>_> * __thiscall
TPZSYsmpMatrix<std::complex<long_double>_>::operator-
          (TPZSYsmpMatrix<std::complex<long_double>_> *__return_storage_ptr__,
          TPZSYsmpMatrix<std::complex<long_double>_> *this,
          TPZSYsmpMatrix<std::complex<long_double>_> *mat)

{
  longdouble lVar1;
  complex<long_double> *pcVar2;
  complex<long_double> *pcVar3;
  long lVar4;
  long lVar5;
  
  (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0x4a])(this);
  TPZSYsmpMatrix(__return_storage_ptr__,this);
  lVar4 = (__return_storage_ptr__->fA).fNElements;
  if (0 < lVar4) {
    lVar5 = 0x10;
    do {
      pcVar2 = (mat->fA).fStore;
      pcVar3 = (__return_storage_ptr__->fA).fStore;
      lVar1 = *(longdouble *)(pcVar2->_M_value + lVar5);
      *(longdouble *)(pcVar3->_M_value + lVar5 + -0x10) =
           *(longdouble *)(pcVar3->_M_value + lVar5 + -0x10) -
           *(longdouble *)(pcVar2->_M_value + lVar5 + -0x10);
      *(longdouble *)(pcVar3->_M_value + lVar5) = *(longdouble *)(pcVar3->_M_value + lVar5) - lVar1;
      lVar5 = lVar5 + 0x20;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

TPZSYsmpMatrix<TVar> TPZSYsmpMatrix<TVar>::operator-(const TPZSYsmpMatrix<TVar>&mat) const
{
	CheckTypeCompatibility(this,&mat);
	auto res(*this);
  const auto sizeA = res.fA.size();
  for(auto i = 0; i < sizeA; i++) res.fA[i] -= mat.fA[i];
	return res;
}